

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

uintmax_t __thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
MyHash::operator()(MyHash *this,string_type *s)

{
  bool bVar1;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *__lhs;
  reference pwVar2;
  char_type c;
  const_iterator __end0;
  const_iterator __begin0;
  string_type *__range4;
  uintmax_t p_pow;
  uintmax_t hash_value;
  int m;
  int p;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_38 [2];
  ulong local_28;
  uintmax_t local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 0x1f;
  local_18 = 0x3b9aca09;
  local_20 = 0;
  local_28 = 1;
  local_38[0]._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  __lhs = (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *)std::__cxx11::wstring::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (__lhs,(__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(local_38);
    in_stack_ffffffffffffffbc = *pwVar2;
    local_20 = (local_20 + (long)(in_stack_ffffffffffffffbc + L'\xffffffa0') * local_28) %
               0x3b9aca09;
    local_28 = (local_28 * 0x1f) % 0x3b9aca09;
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(local_38);
  }
  return local_20;
}

Assistant:

std::uintmax_t operator()(string_type const& s) const noexcept
            {
                const int p = 31;
                const int m = static_cast<int>(1e9) + 9;
                std::uintmax_t hash_value = 0;
                std::uintmax_t p_pow = 1;
                for (char_type c : s) {
                    hash_value = (hash_value + (c - 'a' + 1) * p_pow) % m;
                    p_pow = (p_pow * p) % m;
                }
                return hash_value;   
            }